

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstats.cpp
# Opt level: O3

optional<kernel::CCoinsStats> *
kernel::ComputeUTXOStats
          (optional<kernel::CCoinsStats> *__return_storage_ptr__,CoinStatsHashType hash_type,
          CCoinsView *view,BlockManager *blockman,function<void_()> *interruption_point)

{
  long lVar1;
  uint256 *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint32_t uVar5;
  char cVar6;
  char cVar7;
  int iVar8;
  CBlockIndex *pCVar9;
  CBlockIndex **ppCVar10;
  mapped_type *pmVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar12;
  char *__function;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_00;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_01;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_02;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_03;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_04;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_05;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_06;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *outputs_07;
  CScript *pCVar13;
  CSHA256 *pCVar14;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *hash;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  *pmVar15;
  long in_FS_OFFSET;
  byte bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  CBlockIndex *pindex;
  long *local_7c0;
  CCoinsStats stats;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  undefined4 local_6d8;
  undefined4 uStack_6d4;
  undefined4 uStack_6d0;
  undefined4 uStack_6cc;
  undefined4 local_6c8;
  uint uStack_6c4;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  outputs_2;
  uint256 out;
  undefined4 uStack_c8;
  uint local_c4;
  COutPoint key;
  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
  outputs;
  Txid prevkey;
  
  bVar16 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock7.super_unique_lock._0_9_ = ZEXT89(0x139c540);
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock7.super_unique_lock);
  (*view->_vptr_CCoinsView[2])(&outputs_2,view);
  pCVar9 = ::node::BlockManager::LookupBlockIndex(blockman,(uint256 *)&outputs_2);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock7.super_unique_lock);
  pindex = pCVar9;
  ppCVar10 = inline_assertion_check<true,CBlockIndex*&>
                       (&pindex,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/coinstats.cpp"
                        ,0x9d,"ComputeUTXOStats","pindex");
  puVar2 = pindex->phashBlock;
  if (puVar2 == (uint256 *)0x0) {
    __assert_fail("phashBlock != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                  ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
  }
  outputs_2._M_t._M_impl._0_1_ = (puVar2->super_base_blob<256U>).m_data._M_elems[0];
  outputs_2._M_t._M_impl._1_1_ = (puVar2->super_base_blob<256U>).m_data._M_elems[1];
  outputs_2._M_t._M_impl._2_1_ = (puVar2->super_base_blob<256U>).m_data._M_elems[2];
  outputs_2._M_t._M_impl._3_1_ = (puVar2->super_base_blob<256U>).m_data._M_elems[3];
  outputs_2._M_t._M_impl._4_1_ = (puVar2->super_base_blob<256U>).m_data._M_elems[4];
  outputs_2._M_t._M_impl._5_1_ = (puVar2->super_base_blob<256U>).m_data._M_elems[5];
  outputs_2._M_t._M_impl._6_1_ = (puVar2->super_base_blob<256U>).m_data._M_elems[6];
  outputs_2._M_t._M_impl._7_1_ = (puVar2->super_base_blob<256U>).m_data._M_elems[7];
  outputs_2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
  outputs_2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
  outputs_2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       *(_Base_ptr *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
  CCoinsStats::CCoinsStats(&stats,(*ppCVar10)->nHeight,(uint256 *)&outputs_2);
  if (hash_type == NONE) {
    (*view->_vptr_CCoinsView[5])(&key,view);
    if (key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ == 0) {
      __function = 
      "bool kernel::ComputeUTXOStats(CCoinsView *, CCoinsStats &, T, const std::function<void ()> &) [T = std::nullptr_t]"
      ;
      goto LAB_008b22a7;
    }
    out.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    out.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    outputs_2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &outputs_2._M_t._M_impl.super__Rb_tree_header._M_header;
    outputs_2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         outputs_2._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    outputs_2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    outputs_2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    outputs_2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         outputs_2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (cVar6 = (**(code **)(*(long *)key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems.
                                         _0_8_ + 0x20))(), cVar6 != '\0') {
      if ((interruption_point->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*interruption_point->_M_invoker)((_Any_data *)interruption_point);
      }
      outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      outputs._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
      outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)
           CONCAT44(outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_,0xffffffff);
      CTxOut::CTxOut((CTxOut *)&criticalblock7);
      cVar7 = (**(code **)(*(long *)key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ +
                          0x10))(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_,
                                 &outputs);
      if (cVar7 == '\0') {
LAB_008b1f93:
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/coinstats.cpp"
        ;
        source_file_00._M_len = 100;
        logging_function_00._M_str = "ComputeUTXOStats";
        logging_function_00._M_len = 0x10;
        LogPrintFormatInternal<char[17]>
                  (logging_function_00,source_file_00,0x89,ALL,Error,
                   (ConstevalFormatString<1U>)0xf78662,(char (*) [17])"ComputeUTXOStats");
        if (0x1c < uStack_6c4) {
          free((void *)criticalblock7.super_unique_lock._8_8_);
        }
        goto LAB_008b211e;
      }
      cVar7 = (**(code **)(*(long *)key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ +
                          0x18))(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_,
                                 (CTxOut *)&criticalblock7);
      if (cVar7 == '\0') goto LAB_008b1f93;
      if (outputs_2._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        auVar22[0] = -((uchar)outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent ==
                      out.super_base_blob<256U>.m_data._M_elems[0x10]);
        auVar22[1] = -(outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._1_1_ ==
                      out.super_base_blob<256U>.m_data._M_elems[0x11]);
        auVar22[2] = -(outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._2_1_ ==
                      out.super_base_blob<256U>.m_data._M_elems[0x12]);
        auVar22[3] = -(outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._3_1_ ==
                      out.super_base_blob<256U>.m_data._M_elems[0x13]);
        auVar22[4] = -(outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_1_ ==
                      out.super_base_blob<256U>.m_data._M_elems[0x14]);
        auVar22[5] = -(outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._5_1_ ==
                      out.super_base_blob<256U>.m_data._M_elems[0x15]);
        auVar22[6] = -(outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._6_1_ ==
                      out.super_base_blob<256U>.m_data._M_elems[0x16]);
        auVar22[7] = -(outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._7_1_ ==
                      out.super_base_blob<256U>.m_data._M_elems[0x17]);
        auVar22[8] = -((uchar)outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left ==
                      out.super_base_blob<256U>.m_data._M_elems[0x18]);
        auVar22[9] = -(outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left._1_1_ ==
                      out.super_base_blob<256U>.m_data._M_elems[0x19]);
        auVar22[10] = -(outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left._2_1_ ==
                       out.super_base_blob<256U>.m_data._M_elems[0x1a]);
        auVar22[0xb] = -(outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left._3_1_ ==
                        out.super_base_blob<256U>.m_data._M_elems[0x1b]);
        auVar22[0xc] = -(outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_1_ ==
                        out.super_base_blob<256U>.m_data._M_elems[0x1c]);
        auVar22[0xd] = -(outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left._5_1_ ==
                        out.super_base_blob<256U>.m_data._M_elems[0x1d]);
        auVar22[0xe] = -(outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left._6_1_ ==
                        out.super_base_blob<256U>.m_data._M_elems[0x1e]);
        auVar22[0xf] = -(outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left._7_1_ ==
                        out.super_base_blob<256U>.m_data._M_elems[0x1f]);
        auVar19[0] = -(outputs._M_t._M_impl._0_1_ == out.super_base_blob<256U>.m_data._M_elems[0]);
        auVar19[1] = -(outputs._M_t._M_impl._1_1_ == out.super_base_blob<256U>.m_data._M_elems[1]);
        auVar19[2] = -(outputs._M_t._M_impl._2_1_ == out.super_base_blob<256U>.m_data._M_elems[2]);
        auVar19[3] = -(outputs._M_t._M_impl._3_1_ == out.super_base_blob<256U>.m_data._M_elems[3]);
        auVar19[4] = -(outputs._M_t._M_impl._4_1_ == out.super_base_blob<256U>.m_data._M_elems[4]);
        auVar19[5] = -(outputs._M_t._M_impl._5_1_ == out.super_base_blob<256U>.m_data._M_elems[5]);
        auVar19[6] = -(outputs._M_t._M_impl._6_1_ == out.super_base_blob<256U>.m_data._M_elems[6]);
        auVar19[7] = -(outputs._M_t._M_impl._7_1_ == out.super_base_blob<256U>.m_data._M_elems[7]);
        auVar19[8] = -((undefined1)outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color ==
                      out.super_base_blob<256U>.m_data._M_elems[8]);
        auVar19[9] = -(outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._1_1_ ==
                      out.super_base_blob<256U>.m_data._M_elems[9]);
        auVar19[10] = -(outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._2_1_ ==
                       out.super_base_blob<256U>.m_data._M_elems[10]);
        auVar19[0xb] = -(outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._3_1_ ==
                        out.super_base_blob<256U>.m_data._M_elems[0xb]);
        auVar19[0xc] = -(outputs._M_t._M_impl.super__Rb_tree_header._M_header._4_1_ ==
                        out.super_base_blob<256U>.m_data._M_elems[0xc]);
        auVar19[0xd] = -(outputs._M_t._M_impl.super__Rb_tree_header._M_header._5_1_ ==
                        out.super_base_blob<256U>.m_data._M_elems[0xd]);
        auVar19[0xe] = -(outputs._M_t._M_impl.super__Rb_tree_header._M_header._6_1_ ==
                        out.super_base_blob<256U>.m_data._M_elems[0xe]);
        auVar19[0xf] = -(outputs._M_t._M_impl.super__Rb_tree_header._M_header._7_1_ ==
                        out.super_base_blob<256U>.m_data._M_elems[0xf]);
        auVar19 = auVar19 & auVar22;
        if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) != 0xffff) {
          hash = &outputs_2._M_t;
          ApplyStats(&stats,(uint256 *)&outputs_2._M_t,outputs_05);
          ApplyHash<decltype(nullptr)>((void **)&outputs_2._M_t,(Txid *)hash,outputs_06);
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
          ::clear(&outputs_2._M_t);
        }
      }
      out.super_base_blob<256U>.m_data._M_elems[0x10] =
           (uchar)outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      out.super_base_blob<256U>.m_data._M_elems[0x11] =
           outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._1_1_;
      out.super_base_blob<256U>.m_data._M_elems[0x12] =
           outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._2_1_;
      out.super_base_blob<256U>.m_data._M_elems[0x13] =
           outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._3_1_;
      out.super_base_blob<256U>.m_data._M_elems[0x14] =
           outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_1_;
      out.super_base_blob<256U>.m_data._M_elems[0x15] =
           outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._5_1_;
      out.super_base_blob<256U>.m_data._M_elems[0x16] =
           outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._6_1_;
      out.super_base_blob<256U>.m_data._M_elems[0x17] =
           outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._7_1_;
      out.super_base_blob<256U>.m_data._M_elems[0x18] =
           (uchar)outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      out.super_base_blob<256U>.m_data._M_elems[0x19] =
           outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left._1_1_;
      out.super_base_blob<256U>.m_data._M_elems[0x1a] =
           outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left._2_1_;
      out.super_base_blob<256U>.m_data._M_elems[0x1b] =
           outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left._3_1_;
      out.super_base_blob<256U>.m_data._M_elems[0x1c] =
           outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left._4_1_;
      out.super_base_blob<256U>.m_data._M_elems[0x1d] =
           outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left._5_1_;
      out.super_base_blob<256U>.m_data._M_elems[0x1e] =
           outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left._6_1_;
      out.super_base_blob<256U>.m_data._M_elems[0x1f] =
           outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left._7_1_;
      out.super_base_blob<256U>.m_data._M_elems._0_16_ = outputs._M_t._M_impl._0_16_;
      pmVar11 = std::
                map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                ::operator[]((map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                              *)&outputs_2._M_t,
                             (key_type_conflict3 *)
                             &outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
      (pmVar11->out).nValue = (CAmount)criticalblock7.super_unique_lock._M_device;
      pCVar13 = &(pmVar11->out).scriptPubKey;
      if (0x1c < (pmVar11->out).scriptPubKey.super_CScriptBase._size) {
        free((pCVar13->super_CScriptBase)._union.indirect_contents.indirect);
      }
      *(ulong *)((long)&(pmVar11->out).scriptPubKey.super_CScriptBase._union + 0xc) =
           CONCAT44(uStack_6d0,uStack_6d4);
      *(ulong *)((long)&(pmVar11->out).scriptPubKey.super_CScriptBase._union + 0x14) =
           CONCAT44(local_6c8,uStack_6cc);
      (pCVar13->super_CScriptBase)._union.indirect_contents.indirect =
           (char *)criticalblock7.super_unique_lock._8_8_;
      *(ulong *)((long)&(pmVar11->out).scriptPubKey.super_CScriptBase._union + 8) =
           CONCAT44(uStack_6d4,local_6d8);
      (pmVar11->out).scriptPubKey.super_CScriptBase._size = uStack_6c4;
      uStack_6c4 = 0;
      *(undefined4 *)&pmVar11->field_0x28 = 0;
      stats.coins_count = stats.coins_count + 1;
      (**(code **)(*(long *)key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ + 0x28))
                ();
    }
    if (outputs_2._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      pmVar15 = &outputs_2;
      ApplyStats(&stats,(uint256 *)&outputs_2,outputs_04);
      ApplyHash<decltype(nullptr)>((void **)&outputs_2,(Txid *)pmVar15,outputs_07);
    }
    iVar8 = (*view->_vptr_CCoinsView[8])();
    stats.nDiskSize = CONCAT44(extraout_var_00,iVar8);
LAB_008b211e:
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
    ::~_Rb_tree(&outputs_2._M_t);
    local_7c0 = (long *)key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_;
  }
  else {
    if (hash_type == MUHASH) {
      MuHash3072::MuHash3072((MuHash3072 *)&criticalblock7);
      memcpy(&outputs_2,(MuHash3072 *)&criticalblock7,0x300);
      (*view->_vptr_CCoinsView[5])(&local_7c0,view);
      if (local_7c0 == (long *)0x0) {
        __function = 
        "bool kernel::ComputeUTXOStats(CCoinsView *, CCoinsStats &, T, const std::function<void ()> &) [T = MuHash3072]"
        ;
        goto LAB_008b22a7;
      }
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &outputs._M_t._M_impl.super__Rb_tree_header._M_header;
      outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      outputs._M_t._M_impl.super__Rb_tree_header._M_header._8_16_ = auVar4 << 0x40;
      outputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      while (cVar6 = (**(code **)(*local_7c0 + 0x20))(), cVar6 != '\0') {
        if ((interruption_point->super__Function_base)._M_manager != (_Manager_type)0x0) {
          (*interruption_point->_M_invoker)((_Any_data *)interruption_point);
        }
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        key.n = 0xffffffff;
        CTxOut::CTxOut((CTxOut *)&out);
        cVar7 = (**(code **)(*local_7c0 + 0x10))(local_7c0,&key);
        if ((cVar7 == '\0') ||
           (cVar7 = (**(code **)(*local_7c0 + 0x18))(local_7c0,(CTxOut *)&out), cVar7 == '\0')) {
          source_file._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/coinstats.cpp"
          ;
          source_file._M_len = 100;
          logging_function._M_str = "ComputeUTXOStats";
          logging_function._M_len = 0x10;
          LogPrintFormatInternal<char[17]>
                    (logging_function,source_file,0x89,ALL,Error,(ConstevalFormatString<1U>)0xf78662
                     ,(char (*) [17])"ComputeUTXOStats");
          if (0x1c < local_c4) {
            free((void *)out.super_base_blob<256U>.m_data._M_elems._8_8_);
          }
          goto LAB_008b21ba;
        }
        if (outputs._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          auVar21[0] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10]);
          auVar21[1] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11]);
          auVar21[2] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12]);
          auVar21[3] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13]);
          auVar21[4] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14]);
          auVar21[5] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15]);
          auVar21[6] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16]);
          auVar21[7] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17]);
          auVar21[8] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18]);
          auVar21[9] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19]);
          auVar21[10] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                         prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a]);
          auVar21[0xb] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                          prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b]);
          auVar21[0xc] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                          prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c]);
          auVar21[0xd] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                          prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d]);
          auVar21[0xe] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                          prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e]);
          auVar21[0xf] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                          prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f]);
          auVar18[0] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
          auVar18[1] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
          auVar18[2] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
          auVar18[3] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
          auVar18[4] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
          auVar18[5] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
          auVar18[6] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
          auVar18[7] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
          auVar18[8] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
          auVar18[9] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
          auVar18[10] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                         prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
          auVar18[0xb] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                          prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]);
          auVar18[0xc] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                          prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]);
          auVar18[0xd] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                          prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]);
          auVar18[0xe] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                          prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]);
          auVar18[0xf] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                          prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]);
          auVar18 = auVar18 & auVar21;
          if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) != 0xffff) {
            ApplyStats(&stats,(uint256 *)&outputs._M_t,outputs_03);
            ApplyHash<MuHash3072>
                      ((MuHash3072 *)&outputs_2,&prevkey,
                       (map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                        *)&outputs._M_t);
            std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
            ::clear(&outputs._M_t);
          }
        }
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf];
        pmVar11 = std::
                  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                  ::operator[]((map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                                *)&outputs._M_t,&key.n);
        (pmVar11->out).nValue = out.super_base_blob<256U>.m_data._M_elems._0_8_;
        pCVar13 = &(pmVar11->out).scriptPubKey;
        if (0x1c < (pmVar11->out).scriptPubKey.super_CScriptBase._size) {
          free((pCVar13->super_CScriptBase)._union.indirect_contents.indirect);
        }
        *(ulong *)((long)&(pmVar11->out).scriptPubKey.super_CScriptBase._union + 0xc) =
             CONCAT17(out.super_base_blob<256U>.m_data._M_elems[0x1b],
                      CONCAT16(out.super_base_blob<256U>.m_data._M_elems[0x1a],
                               CONCAT15(out.super_base_blob<256U>.m_data._M_elems[0x19],
                                        CONCAT14(out.super_base_blob<256U>.m_data._M_elems[0x18],
                                                 CONCAT13(out.super_base_blob<256U>.m_data._M_elems
                                                          [0x17],CONCAT12(out.super_base_blob<256U>.
                                                                          m_data._M_elems[0x16],
                                                                          CONCAT11(out.
                                                  super_base_blob<256U>.m_data._M_elems[0x15],
                                                  out.super_base_blob<256U>.m_data._M_elems[0x14])))
                                                ))));
        *(ulong *)((long)&(pmVar11->out).scriptPubKey.super_CScriptBase._union + 0x14) =
             CONCAT44(uStack_c8,
                      CONCAT13(out.super_base_blob<256U>.m_data._M_elems[0x1f],
                               CONCAT12(out.super_base_blob<256U>.m_data._M_elems[0x1e],
                                        CONCAT11(out.super_base_blob<256U>.m_data._M_elems[0x1d],
                                                 out.super_base_blob<256U>.m_data._M_elems[0x1c]))))
        ;
        (pCVar13->super_CScriptBase)._union.indirect_contents.indirect =
             (char *)out.super_base_blob<256U>.m_data._M_elems._8_8_;
        *(ulong *)((long)&(pmVar11->out).scriptPubKey.super_CScriptBase._union + 8) =
             CONCAT17(out.super_base_blob<256U>.m_data._M_elems[0x17],
                      CONCAT16(out.super_base_blob<256U>.m_data._M_elems[0x16],
                               CONCAT15(out.super_base_blob<256U>.m_data._M_elems[0x15],
                                        CONCAT14(out.super_base_blob<256U>.m_data._M_elems[0x14],
                                                 CONCAT13(out.super_base_blob<256U>.m_data._M_elems
                                                          [0x13],CONCAT12(out.super_base_blob<256U>.
                                                                          m_data._M_elems[0x12],
                                                                          CONCAT11(out.
                                                  super_base_blob<256U>.m_data._M_elems[0x11],
                                                  out.super_base_blob<256U>.m_data._M_elems[0x10])))
                                                ))));
        (pmVar11->out).scriptPubKey.super_CScriptBase._size = local_c4;
        local_c4 = 0;
        *(undefined4 *)&pmVar11->field_0x28 = 0;
        stats.coins_count = stats.coins_count + 1;
        (**(code **)(*local_7c0 + 0x28))();
      }
      if (outputs._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        ApplyStats(&stats,(uint256 *)&outputs,outputs_02);
        ApplyHash<MuHash3072>((MuHash3072 *)&outputs_2,&prevkey,&outputs);
      }
      out.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      out.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      MuHash3072::Finalize((MuHash3072 *)&outputs_2,&out);
      auVar19 = (undefined1  [16])out.super_base_blob<256U>.m_data._M_elems._0_16_;
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x11] =
           out.super_base_blob<256U>.m_data._M_elems[0x11];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x10] =
           out.super_base_blob<256U>.m_data._M_elems[0x10];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x12] =
           out.super_base_blob<256U>.m_data._M_elems[0x12];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x13] =
           out.super_base_blob<256U>.m_data._M_elems[0x13];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x14] =
           out.super_base_blob<256U>.m_data._M_elems[0x14];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x15] =
           out.super_base_blob<256U>.m_data._M_elems[0x15];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x16] =
           out.super_base_blob<256U>.m_data._M_elems[0x16];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x17] =
           out.super_base_blob<256U>.m_data._M_elems[0x17];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x19] =
           out.super_base_blob<256U>.m_data._M_elems[0x19];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x18] =
           out.super_base_blob<256U>.m_data._M_elems[0x18];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1a] =
           out.super_base_blob<256U>.m_data._M_elems[0x1a];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1b] =
           out.super_base_blob<256U>.m_data._M_elems[0x1b];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1c] =
           out.super_base_blob<256U>.m_data._M_elems[0x1c];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1d] =
           out.super_base_blob<256U>.m_data._M_elems[0x1d];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1e] =
           out.super_base_blob<256U>.m_data._M_elems[0x1e];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1f] =
           out.super_base_blob<256U>.m_data._M_elems[0x1f];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0] =
           out.super_base_blob<256U>.m_data._M_elems[0];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[1] =
           out.super_base_blob<256U>.m_data._M_elems[1];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[2] =
           out.super_base_blob<256U>.m_data._M_elems[2];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[3] =
           out.super_base_blob<256U>.m_data._M_elems[3];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[4] =
           out.super_base_blob<256U>.m_data._M_elems[4];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[5] =
           out.super_base_blob<256U>.m_data._M_elems[5];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[6] =
           out.super_base_blob<256U>.m_data._M_elems[6];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[7] =
           out.super_base_blob<256U>.m_data._M_elems[7];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[8] =
           out.super_base_blob<256U>.m_data._M_elems[8];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[9] =
           out.super_base_blob<256U>.m_data._M_elems[9];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[10] =
           out.super_base_blob<256U>.m_data._M_elems[10];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xb] =
           out.super_base_blob<256U>.m_data._M_elems[0xb];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xc] =
           out.super_base_blob<256U>.m_data._M_elems[0xc];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xd] =
           out.super_base_blob<256U>.m_data._M_elems[0xd];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xe] =
           out.super_base_blob<256U>.m_data._M_elems[0xe];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xf] =
           out.super_base_blob<256U>.m_data._M_elems[0xf];
      out.super_base_blob<256U>.m_data._M_elems._0_16_ = auVar19;
      iVar8 = (*view->_vptr_CCoinsView[8])();
      stats.nDiskSize = CONCAT44(extraout_var,iVar8);
    }
    else {
      if (hash_type != HASH_SERIALIZED) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/coinstats.cpp"
                      ,0xad,
                      "auto kernel::ComputeUTXOStats(CoinStatsHashType, CCoinsView *, node::BlockManager &, const std::function<void ()> &)::(anonymous class)::operator()() const"
                     );
      }
      criticalblock7.super_unique_lock._M_device = (mutex_type *)0x0;
      criticalblock7.super_unique_lock._M_owns = false;
      criticalblock7.super_unique_lock._9_7_ = 0;
      CSHA256::CSHA256((CSHA256 *)&criticalblock7);
      pCVar14 = (CSHA256 *)&criticalblock7;
      pmVar15 = &outputs_2;
      for (lVar12 = 0xd; lVar12 != 0; lVar12 = lVar12 + -1) {
        uVar5 = pCVar14->s[1];
        *(uint32_t *)&(pmVar15->_M_t)._M_impl.field_0x0 = pCVar14->s[0];
        *(uint32_t *)&(pmVar15->_M_t)._M_impl.field_0x4 = uVar5;
        pCVar14 = (CSHA256 *)((long)pCVar14 + (ulong)bVar16 * -0x10 + 8);
        pmVar15 = (map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                   *)((long)pmVar15 + (ulong)bVar16 * -0x10 + 8);
      }
      (*view->_vptr_CCoinsView[5])(&local_7c0,view);
      if (local_7c0 == (long *)0x0) {
        __function = 
        "bool kernel::ComputeUTXOStats(CCoinsView *, CCoinsStats &, T, const std::function<void ()> &) [T = HashWriter]"
        ;
LAB_008b22a7:
        __assert_fail("pcursor",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/coinstats.cpp"
                      ,0x77,__function);
      }
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &outputs._M_t._M_impl.super__Rb_tree_header._M_header;
      outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = outputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      outputs._M_t._M_impl.super__Rb_tree_header._M_header._8_16_ = auVar3 << 0x40;
      outputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      while (cVar6 = (**(code **)(*local_7c0 + 0x20))(), cVar6 != '\0') {
        if ((interruption_point->super__Function_base)._M_manager != (_Manager_type)0x0) {
          (*interruption_point->_M_invoker)((_Any_data *)interruption_point);
        }
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        key.n = 0xffffffff;
        CTxOut::CTxOut((CTxOut *)&out);
        cVar7 = (**(code **)(*local_7c0 + 0x10))(local_7c0,&key);
        if ((cVar7 == '\0') ||
           (cVar7 = (**(code **)(*local_7c0 + 0x18))(local_7c0,(CTxOut *)&out), cVar7 == '\0')) {
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/kernel/coinstats.cpp"
          ;
          source_file_01._M_len = 100;
          logging_function_01._M_str = "ComputeUTXOStats";
          logging_function_01._M_len = 0x10;
          LogPrintFormatInternal<char[17]>
                    (logging_function_01,source_file_01,0x89,ALL,Error,
                     (ConstevalFormatString<1U>)0xf78662,(char (*) [17])"ComputeUTXOStats");
          if (0x1c < local_c4) {
            free((void *)out.super_base_blob<256U>.m_data._M_elems._8_8_);
          }
          goto LAB_008b21ba;
        }
        if (outputs._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          auVar20[0] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10]);
          auVar20[1] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11]);
          auVar20[2] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12]);
          auVar20[3] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13]);
          auVar20[4] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14]);
          auVar20[5] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15]);
          auVar20[6] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16]);
          auVar20[7] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17]);
          auVar20[8] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18]);
          auVar20[9] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19]);
          auVar20[10] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                         prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a]);
          auVar20[0xb] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                          prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b]);
          auVar20[0xc] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                          prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c]);
          auVar20[0xd] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                          prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d]);
          auVar20[0xe] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                          prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e]);
          auVar20[0xf] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                          prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f]);
          auVar17[0] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
          auVar17[1] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[1]);
          auVar17[2] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[2]);
          auVar17[3] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[3]);
          auVar17[4] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[4]);
          auVar17[5] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[5]);
          auVar17[6] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[6]);
          auVar17[7] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[7]);
          auVar17[8] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[8]);
          auVar17[9] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] ==
                        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[9]);
          auVar17[10] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] ==
                         prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[10]);
          auVar17[0xb] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] ==
                          prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb]);
          auVar17[0xc] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] ==
                          prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc]);
          auVar17[0xd] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] ==
                          prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd]);
          auVar17[0xe] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] ==
                          prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe]);
          auVar17[0xf] = -(key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] ==
                          prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf]);
          auVar17 = auVar17 & auVar20;
          if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) != 0xffff) {
            ApplyStats(&stats,(uint256 *)&outputs._M_t,outputs_01);
            ApplyHash<HashWriter>
                      ((HashWriter *)&outputs_2,&prevkey,
                       (map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                        *)&outputs._M_t);
            std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
            ::clear(&outputs._M_t);
          }
        }
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe];
        prevkey.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] =
             key.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf];
        pmVar11 = std::
                  map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                  ::operator[]((map<unsigned_int,_Coin,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
                                *)&outputs._M_t,&key.n);
        (pmVar11->out).nValue = out.super_base_blob<256U>.m_data._M_elems._0_8_;
        pCVar13 = &(pmVar11->out).scriptPubKey;
        if (0x1c < (pmVar11->out).scriptPubKey.super_CScriptBase._size) {
          free((pCVar13->super_CScriptBase)._union.indirect_contents.indirect);
        }
        *(ulong *)((long)&(pmVar11->out).scriptPubKey.super_CScriptBase._union + 0xc) =
             CONCAT17(out.super_base_blob<256U>.m_data._M_elems[0x1b],
                      CONCAT16(out.super_base_blob<256U>.m_data._M_elems[0x1a],
                               CONCAT15(out.super_base_blob<256U>.m_data._M_elems[0x19],
                                        CONCAT14(out.super_base_blob<256U>.m_data._M_elems[0x18],
                                                 CONCAT13(out.super_base_blob<256U>.m_data._M_elems
                                                          [0x17],CONCAT12(out.super_base_blob<256U>.
                                                                          m_data._M_elems[0x16],
                                                                          CONCAT11(out.
                                                  super_base_blob<256U>.m_data._M_elems[0x15],
                                                  out.super_base_blob<256U>.m_data._M_elems[0x14])))
                                                ))));
        *(ulong *)((long)&(pmVar11->out).scriptPubKey.super_CScriptBase._union + 0x14) =
             CONCAT44(uStack_c8,
                      CONCAT13(out.super_base_blob<256U>.m_data._M_elems[0x1f],
                               CONCAT12(out.super_base_blob<256U>.m_data._M_elems[0x1e],
                                        CONCAT11(out.super_base_blob<256U>.m_data._M_elems[0x1d],
                                                 out.super_base_blob<256U>.m_data._M_elems[0x1c]))))
        ;
        (pCVar13->super_CScriptBase)._union.indirect_contents.indirect =
             (char *)out.super_base_blob<256U>.m_data._M_elems._8_8_;
        *(ulong *)((long)&(pmVar11->out).scriptPubKey.super_CScriptBase._union + 8) =
             CONCAT17(out.super_base_blob<256U>.m_data._M_elems[0x17],
                      CONCAT16(out.super_base_blob<256U>.m_data._M_elems[0x16],
                               CONCAT15(out.super_base_blob<256U>.m_data._M_elems[0x15],
                                        CONCAT14(out.super_base_blob<256U>.m_data._M_elems[0x14],
                                                 CONCAT13(out.super_base_blob<256U>.m_data._M_elems
                                                          [0x13],CONCAT12(out.super_base_blob<256U>.
                                                                          m_data._M_elems[0x12],
                                                                          CONCAT11(out.
                                                  super_base_blob<256U>.m_data._M_elems[0x11],
                                                  out.super_base_blob<256U>.m_data._M_elems[0x10])))
                                                ))));
        (pmVar11->out).scriptPubKey.super_CScriptBase._size = local_c4;
        local_c4 = 0;
        *(undefined4 *)&pmVar11->field_0x28 = 0;
        stats.coins_count = stats.coins_count + 1;
        (**(code **)(*local_7c0 + 0x28))();
      }
      if (outputs._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        ApplyStats(&stats,(uint256 *)&outputs,outputs_00);
        ApplyHash<HashWriter>((HashWriter *)&outputs_2,&prevkey,&outputs);
      }
      HashWriter::GetHash(&out,(HashWriter *)&outputs_2);
      auVar19 = (undefined1  [16])out.super_base_blob<256U>.m_data._M_elems._0_16_;
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x11] =
           out.super_base_blob<256U>.m_data._M_elems[0x11];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x10] =
           out.super_base_blob<256U>.m_data._M_elems[0x10];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x12] =
           out.super_base_blob<256U>.m_data._M_elems[0x12];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x13] =
           out.super_base_blob<256U>.m_data._M_elems[0x13];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x14] =
           out.super_base_blob<256U>.m_data._M_elems[0x14];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x15] =
           out.super_base_blob<256U>.m_data._M_elems[0x15];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x16] =
           out.super_base_blob<256U>.m_data._M_elems[0x16];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x17] =
           out.super_base_blob<256U>.m_data._M_elems[0x17];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x19] =
           out.super_base_blob<256U>.m_data._M_elems[0x19];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x18] =
           out.super_base_blob<256U>.m_data._M_elems[0x18];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1a] =
           out.super_base_blob<256U>.m_data._M_elems[0x1a];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1b] =
           out.super_base_blob<256U>.m_data._M_elems[0x1b];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1c] =
           out.super_base_blob<256U>.m_data._M_elems[0x1c];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1d] =
           out.super_base_blob<256U>.m_data._M_elems[0x1d];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1e] =
           out.super_base_blob<256U>.m_data._M_elems[0x1e];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0x1f] =
           out.super_base_blob<256U>.m_data._M_elems[0x1f];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0] =
           out.super_base_blob<256U>.m_data._M_elems[0];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[1] =
           out.super_base_blob<256U>.m_data._M_elems[1];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[2] =
           out.super_base_blob<256U>.m_data._M_elems[2];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[3] =
           out.super_base_blob<256U>.m_data._M_elems[3];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[4] =
           out.super_base_blob<256U>.m_data._M_elems[4];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[5] =
           out.super_base_blob<256U>.m_data._M_elems[5];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[6] =
           out.super_base_blob<256U>.m_data._M_elems[6];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[7] =
           out.super_base_blob<256U>.m_data._M_elems[7];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[8] =
           out.super_base_blob<256U>.m_data._M_elems[8];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[9] =
           out.super_base_blob<256U>.m_data._M_elems[9];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[10] =
           out.super_base_blob<256U>.m_data._M_elems[10];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xb] =
           out.super_base_blob<256U>.m_data._M_elems[0xb];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xc] =
           out.super_base_blob<256U>.m_data._M_elems[0xc];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xd] =
           out.super_base_blob<256U>.m_data._M_elems[0xd];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xe] =
           out.super_base_blob<256U>.m_data._M_elems[0xe];
      stats.hashSerialized.super_base_blob<256U>.m_data._M_elems[0xf] =
           out.super_base_blob<256U>.m_data._M_elems[0xf];
      out.super_base_blob<256U>.m_data._M_elems._0_16_ = auVar19;
      iVar8 = (*view->_vptr_CCoinsView[8])();
      stats.nDiskSize = CONCAT44(extraout_var_01,iVar8);
    }
LAB_008b21ba:
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Coin>,_std::_Select1st<std::pair<const_unsigned_int,_Coin>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Coin>_>_>
    ::~_Rb_tree(&outputs._M_t);
  }
  if (local_7c0 != (long *)0x0) {
    (**(code **)(*local_7c0 + 8))();
  }
  if (cVar6 == '\0') {
    memcpy(__return_storage_ptr__,&stats,0xd0);
  }
  (__return_storage_ptr__->super__Optional_base<kernel::CCoinsStats,_true,_true>)._M_payload.
  super__Optional_payload_base<kernel::CCoinsStats>._M_engaged = cVar6 == '\0';
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<CCoinsStats> ComputeUTXOStats(CoinStatsHashType hash_type, CCoinsView* view, node::BlockManager& blockman, const std::function<void()>& interruption_point)
{
    CBlockIndex* pindex = WITH_LOCK(::cs_main, return blockman.LookupBlockIndex(view->GetBestBlock()));
    CCoinsStats stats{Assert(pindex)->nHeight, pindex->GetBlockHash()};

    bool success = [&]() -> bool {
        switch (hash_type) {
        case(CoinStatsHashType::HASH_SERIALIZED): {
            HashWriter ss{};
            return ComputeUTXOStats(view, stats, ss, interruption_point);
        }
        case(CoinStatsHashType::MUHASH): {
            MuHash3072 muhash;
            return ComputeUTXOStats(view, stats, muhash, interruption_point);
        }
        case(CoinStatsHashType::NONE): {
            return ComputeUTXOStats(view, stats, nullptr, interruption_point);
        }
        } // no default case, so the compiler can warn about missing cases
        assert(false);
    }();

    if (!success) {
        return std::nullopt;
    }
    return stats;
}